

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample3DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,float r,
          IVec3 *offset)

{
  FilterMode FVar1;
  int iVar2;
  WrapMode WVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  TextureChannelClass TVar13;
  uint uVar14;
  uint uVar15;
  FilterMode FVar16;
  int iVar17;
  uint uVar18;
  undefined4 in_register_00000014;
  uint *puVar19;
  FilterMode FVar20;
  int i;
  FilterMode FVar21;
  FilterMode FVar22;
  int *in_R8;
  WrapMode WVar23;
  FilterMode FVar24;
  WrapMode WVar25;
  WrapMode WVar26;
  int iVar27;
  Vector<float,_4> *res_10;
  ConstPixelBufferAccess *pCVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  uint uVar39;
  float fVar40;
  undefined1 in_register_00001204 [12];
  undefined1 auVar41 [16];
  undefined1 in_register_00001244 [12];
  undefined1 auVar42 [16];
  undefined8 uVar44;
  undefined1 auVar43 [16];
  float fVar45;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  Vector<float,_4> VVar50;
  Vec4 VVar51;
  Vec4 VVar52;
  Vec4 p111;
  Vec4 p011;
  Vec4 p101;
  Vec4 p001;
  Vec4 p110;
  Vec4 p010;
  Vec4 p100;
  Vec4 p000;
  WrapMode local_160;
  FilterMode local_15c;
  TextureFormat local_128;
  uint uStack_120;
  uint uStack_11c;
  float local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  FilterMode local_100;
  WrapMode local_fc;
  undefined1 local_f8 [16];
  ConstPixelBufferAccess *local_e0;
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [20];
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar55;
  undefined8 uVar56;
  
  auVar42._4_12_ = in_register_00001244;
  auVar42._0_4_ = t;
  puVar19 = (uint *)CONCAT44(in_register_00000014,filter);
  uVar39 = in_register_00001204._0_4_;
  uVar14 = in_register_00001204._4_4_;
  uVar15 = in_register_00001204._8_4_;
  local_118 = r;
  uStack_114 = in_XMM2_Db;
  uStack_110 = in_XMM2_Dc;
  uStack_10c = in_XMM2_Dd;
  if ((char)puVar19[6] == '\x01') {
    uVar18 = *puVar19;
    fVar40 = 0.0;
    uVar47 = 0;
    uVar48 = 0;
    uVar49 = 0;
    if (uVar18 < 7) {
      fVar40 = (float)(int)sampler->wrapR;
      if ((0x57U >> (uVar18 & 0x1f) & 1) == 0) {
        local_f8 = auVar42;
        local_d8 = fVar40;
        if (uVar18 == 3) {
          fVar40 = floorf(s);
          fVar40 = (s - fVar40) * local_d8;
          auVar42 = local_f8;
          r = local_118;
          in_XMM2_Db = uStack_114;
          in_XMM2_Dc = uStack_110;
          in_XMM2_Dd = uStack_10c;
          uVar47 = uVar39;
          uVar48 = uVar14;
          uVar49 = uVar15;
        }
        else {
          fVar45 = s * 0.5;
          fVar40 = floorf(fVar45);
          if ((fVar45 - fVar40 != 0.5) || (NAN(fVar45 - fVar40))) {
            fVar40 = floorf(fVar45 + 0.5);
          }
          else {
            fVar40 = 0.0;
            if (((long)(fVar45 + -0.5) & 1U) != 0) {
              fVar40 = 1.0;
            }
            fVar40 = fVar45 + -0.5 + fVar40;
          }
          fVar40 = s - (fVar40 + fVar40);
          uVar18 = -(uint)(-fVar40 <= fVar40);
          uVar47 = uVar39 & (uVar39 ^ 0x80000000);
          uVar48 = uVar14 & (uVar14 ^ 0x80000000);
          uVar49 = uVar15 & (uVar15 ^ 0x80000000);
          fVar40 = (float)(~uVar18 & (uint)-fVar40 | (uint)fVar40 & uVar18) * local_d8;
          auVar42 = local_f8;
          r = local_118;
          in_XMM2_Db = uStack_114;
          in_XMM2_Dc = uStack_110;
          in_XMM2_Dd = uStack_10c;
        }
      }
      else {
        fVar40 = fVar40 * s;
        uVar47 = 0;
        uVar48 = 0;
        uVar49 = 0;
      }
    }
    local_f8 = ZEXT816(0);
    uVar18 = puVar19[1];
    uStack_114 = in_XMM2_Db;
    uStack_110 = in_XMM2_Dc;
    uStack_10c = in_XMM2_Dd;
    s = fVar40;
    uVar39 = uVar47;
    uVar14 = uVar48;
    uVar15 = uVar49;
    if (uVar18 < 7) {
      fVar46 = (float)(int)sampler->minFilter;
      fVar45 = auVar42._0_4_;
      if ((0x57U >> (uVar18 & 0x1f) & 1) == 0) {
        local_118 = r;
        local_f8 = auVar42;
        local_d8 = fVar40;
        uStack_d4 = uVar47;
        uStack_d0 = uVar48;
        uStack_cc = uVar49;
        if (uVar18 == 3) {
          fVar40 = floorf(fVar45);
          local_f8._0_4_ = (local_f8._0_4_ - fVar40) * fVar46;
          r = local_118;
          s = local_d8;
          uVar39 = uStack_d4;
          uVar14 = uStack_d0;
          uVar15 = uStack_cc;
        }
        else {
          fVar45 = fVar45 * 0.5;
          fVar40 = floorf(fVar45);
          if ((fVar45 - fVar40 != 0.5) || (NAN(fVar45 - fVar40))) {
            fVar40 = floorf(fVar45 + 0.5);
          }
          else {
            fVar40 = 0.0;
            if (((long)(fVar45 + -0.5) & 1U) != 0) {
              fVar40 = 1.0;
            }
            fVar40 = fVar45 + -0.5 + fVar40;
          }
          local_f8._0_4_ = (float)local_f8._0_4_ - (fVar40 + fVar40);
          uVar39 = -(uint)(-(float)local_f8._0_4_ <= (float)local_f8._0_4_);
          auVar42._0_4_ = (float)(local_f8._0_4_ & uVar39);
          auVar42._4_4_ = (float)(local_f8._4_4_ & (local_f8._4_4_ ^ 0x80000000));
          auVar42._8_4_ = (float)(local_f8._8_4_ & (local_f8._8_4_ ^ 0x80000000));
          auVar42._12_4_ = (float)(local_f8._12_4_ & (local_f8._12_4_ ^ 0x80000000));
          auVar43 = ZEXT416(~uVar39 & (uint)-(float)local_f8._0_4_) | auVar42;
          local_f8._4_12_ = auVar43._4_12_;
          local_f8._0_4_ = auVar43._0_4_ * fVar46;
          r = local_118;
          s = local_d8;
          uVar39 = uStack_d4;
          uVar14 = uStack_d0;
          uVar15 = uStack_cc;
        }
      }
      else {
        local_f8 = ZEXT416((uint)(fVar46 * fVar45));
      }
    }
    uVar18 = puVar19[2];
    if (uVar18 < 7) {
      fVar40 = (float)(int)sampler->magFilter;
      auVar42 = ZEXT416((uint)fVar40);
      if ((0x57U >> (uVar18 & 0x1f) & 1) == 0) {
        local_118 = r;
        local_d8 = s;
        uStack_d4 = uVar39;
        uStack_d0 = uVar14;
        uStack_cc = uVar15;
        if (uVar18 == 3) {
          fVar45 = floorf(r);
          local_118 = (local_118 - fVar45) * fVar40;
          s = local_d8;
          uVar39 = uStack_d4;
          uVar14 = uStack_d0;
          uVar15 = uStack_cc;
        }
        else {
          fVar45 = r * 0.5;
          fVar46 = floorf(fVar45);
          if ((fVar45 - fVar46 != 0.5) || (NAN(fVar45 - fVar46))) {
            fVar46 = floorf(fVar45 + 0.5);
          }
          else {
            fVar46 = 0.0;
            if (((long)(fVar45 + -0.5) & 1U) != 0) {
              fVar46 = 1.0;
            }
            fVar46 = fVar45 + -0.5 + fVar46;
          }
          local_118 = local_118 - (fVar46 + fVar46);
          uVar39 = -(uint)(-local_118 <= local_118);
          auVar43._0_4_ = (uint)local_118 & uVar39;
          auVar43._4_4_ = uStack_114 & (uStack_114 ^ 0x80000000);
          auVar43._8_4_ = uStack_110 & (uStack_110 ^ 0x80000000);
          auVar43._12_4_ = uStack_10c & (uStack_10c ^ 0x80000000);
          auVar43 = ZEXT416(~uVar39 & (uint)-local_118) | auVar43;
          auVar42._4_12_ = auVar43._4_12_;
          auVar42._0_4_ = auVar43._0_4_ * fVar40;
          uStack_114 = auVar43._4_4_;
          uStack_110 = auVar43._8_4_;
          uStack_10c = auVar43._12_4_;
          local_118 = auVar42._0_4_;
          s = local_d8;
          uVar39 = uStack_d4;
          uVar14 = uStack_d0;
          uVar15 = uStack_cc;
        }
      }
      else {
        local_118 = r * fVar40;
      }
    }
    else {
      local_118 = 0.0;
      uStack_114 = 0;
      uStack_110 = 0;
      uStack_10c = 0;
    }
  }
  else {
    local_f8._4_4_ = in_register_00001244._0_4_;
    local_f8._0_4_ = t;
    local_f8._8_4_ = in_register_00001244._4_4_;
    local_f8._12_4_ = in_register_00001244._8_4_;
  }
  i = (int)sampler;
  local_e0 = this;
  if ((int)offset == 0) {
    WVar3 = sampler->wrapR;
    FVar1 = sampler->minFilter;
    FVar20 = sampler->magFilter;
    fVar40 = floorf(s);
    WVar23 = (int)fVar40 + *in_R8;
    fVar40 = floorf((float)local_f8._0_4_);
    FVar21 = (int)fVar40 + in_R8[1];
    fVar40 = floorf(local_118);
    if ((((*puVar19 != 1) || ((int)WVar23 < (int)WVar3 && -1 < (int)WVar23)) &&
        ((puVar19[1] != 1 || ((int)FVar21 < (int)FVar1 && -1 < (int)FVar21)))) &&
       ((puVar19[2] != 1 || (-1 < (int)fVar40 + in_R8[2] && (int)fVar40 + in_R8[2] < (int)FVar20))))
    {
      WVar25 = WVar23;
      WVar26 = CLAMP_TO_EDGE;
      switch(*puVar19) {
      case 0:
      case 5:
        WVar25 = WVar3 - CLAMP_TO_BORDER;
        if ((int)WVar23 < (int)(WVar3 - CLAMP_TO_BORDER)) {
          WVar25 = WVar23;
        }
        WVar26 = CLAMP_TO_EDGE;
        if (-1 < (int)WVar23) {
          WVar26 = WVar25;
        }
        break;
      case 1:
        if ((int)WVar23 < (int)WVar3) {
          WVar3 = WVar23;
        }
        WVar26 = ~CLAMP_TO_EDGE;
        if (-2 < (int)WVar23) {
          WVar26 = WVar3;
        }
        break;
      case 2:
      case 3:
        WVar26 = ((int)WVar23 % (int)WVar3 >> 0x1f & WVar3) + (int)WVar23 % (int)WVar3;
        break;
      case 6:
        WVar25 = WVar3;
        if ((int)WVar23 < (int)WVar3) {
          WVar25 = WVar23;
        }
        if (SBORROW4(WVar23,-WVar3) != (int)(WVar23 + WVar3) < 0) {
          WVar25 = -WVar3;
        }
      case 4:
        iVar17 = (int)WVar25 % (int)(WVar3 * 2);
        uVar39 = (iVar17 - WVar3) + (iVar17 >> 0x1f & WVar3 * 2);
        WVar26 = ~((int)uVar39 >> 0x1f ^ uVar39) + WVar3;
      }
      FVar20 = FVar21;
      FVar22 = NEAREST;
      switch(puVar19[1]) {
      case 0:
      case 5:
        FVar20 = FVar1 - LINEAR;
        if ((int)FVar21 < (int)(FVar1 - LINEAR)) {
          FVar20 = FVar21;
        }
        FVar22 = NEAREST;
        if (-1 < (int)FVar21) {
          FVar22 = FVar20;
        }
        break;
      case 1:
        if ((int)FVar21 < (int)FVar1) {
          FVar1 = FVar21;
        }
        FVar22 = ~NEAREST;
        if (-2 < (int)FVar21) {
          FVar22 = FVar1;
        }
        break;
      case 2:
      case 3:
        FVar22 = ((int)FVar21 % (int)FVar1 >> 0x1f & FVar1) + (int)FVar21 % (int)FVar1;
        break;
      case 6:
        FVar20 = FVar1;
        if ((int)FVar21 < (int)FVar1) {
          FVar20 = FVar21;
        }
        if (SBORROW4(FVar21,-FVar1) != (int)(FVar21 + FVar1) < 0) {
          FVar20 = -FVar1;
        }
      case 4:
        iVar17 = (int)FVar20 % (int)(FVar1 * 2);
        uVar39 = (iVar17 - FVar1) + (iVar17 >> 0x1f & FVar1 * 2);
        FVar22 = ~((int)uVar39 >> 0x1f ^ uVar39) + FVar1;
      }
      switch(puVar19[2]) {
      case 0:
      case 5:
        break;
      case 1:
        break;
      case 2:
      case 3:
        break;
      case 6:
      case 4:
      }
      VVar52 = lookup(local_e0,i,WVar26,FVar22);
      VVar52.m_data[0] = VVar52.m_data[0];
      auVar54._4_4_ = VVar52.m_data[1];
      register0x00001240 = VVar52.m_data[2];
      register0x00001244 = VVar52.m_data[3];
      return (Vec4)VVar52.m_data;
    }
    TVar13 = getTextureChannelClass(sampler->wrapT);
    this = local_e0;
    uVar44 = auVar42._8_8_;
    pCVar28 = local_e0;
    auVar41 = _DAT_00234d20;
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      VVar50 = sampleTextureBorder<float>(&local_e0->m_format,sampler);
      auVar42._0_8_ = VVar50.m_data._8_8_;
      auVar42._8_8_ = uVar44;
      auVar41._0_8_ = VVar50.m_data._0_8_;
      auVar41._8_8_ = extraout_XMM0_Qb;
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      (pCVar28->m_format).order = R;
      (pCVar28->m_format).type = SNORM_INT8;
      (pCVar28->m_size).m_data[0] = 0;
      (pCVar28->m_size).m_data[1] = 0;
      auVar41._0_4_ = (float)(int)local_128.order;
      auVar41._4_4_ = (float)(int)local_128.type;
      auVar41._8_4_ = (float)(int)uStack_120;
      auVar41._12_4_ = (float)(int)uStack_11c;
    default:
switchD_001e6413_default:
      (this->m_format).order = (int)auVar41._0_8_;
      (this->m_format).type = (int)((ulong)auVar41._0_8_ >> 0x20);
      (this->m_size).m_data[0] = auVar41._8_4_;
      (this->m_size).m_data[1] = auVar41._12_4_;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      auVar41 = ZEXT816(0);
      (pCVar28->m_format).order = (int)auVar41._0_8_;
      (pCVar28->m_format).type = (int)((ulong)auVar41._0_8_ >> 0x20);
      (pCVar28->m_size).m_data[0] = auVar41._8_4_;
      (pCVar28->m_size).m_data[1] = auVar41._12_4_;
      auVar42._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      auVar42._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      auVar42._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      auVar42._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      (pCVar28->m_format).order = (ChannelOrder)auVar42._0_4_;
      (pCVar28->m_format).type = (ChannelType)auVar42._4_4_;
      (pCVar28->m_size).m_data[0] = (int)auVar42._8_4_;
      (pCVar28->m_size).m_data[1] = (int)auVar42._12_4_;
    }
    goto LAB_001e73e4;
  }
  if ((int)offset != 1) {
    auVar41 = ZEXT816(0);
    goto switchD_001e6413_default;
  }
  WVar23 = sampler->wrapR;
  FVar1 = sampler->minFilter;
  FVar20 = sampler->magFilter;
  local_d8 = s + -0.5;
  uStack_d4 = uVar39;
  uStack_d0 = uVar14;
  uStack_cc = uVar15;
  local_bc = floorf(local_d8);
  iVar29 = (int)local_bc;
  iVar17 = *in_R8;
  iVar2 = in_R8[1];
  WVar3 = iVar17 + 1 + iVar29;
  local_f8._0_4_ = (float)local_f8._0_4_ + -0.5;
  local_c0 = floorf((float)local_f8._0_4_);
  iVar27 = (int)local_c0;
  local_118 = local_118 + -0.5;
  local_c4 = floorf(local_118);
  uVar39 = *puVar19;
  local_160 = CLAMP_TO_EDGE;
  local_fc = CLAMP_TO_EDGE;
  if (6 < uVar39) goto LAB_001e66fb;
  WVar25 = iVar17 + iVar29;
  switch(uVar39) {
  case 0:
    local_160 = WVar23 - CLAMP_TO_BORDER;
    local_fc = local_160;
    if ((int)WVar25 < (int)local_160) {
      local_fc = WVar25;
    }
    if ((int)WVar25 < 0) {
      local_fc = CLAMP_TO_EDGE;
    }
    if ((int)WVar3 < (int)local_160) {
      local_160 = WVar3;
    }
    if ((int)WVar3 < 0) {
      local_160 = CLAMP_TO_EDGE;
    }
    break;
  case 1:
    local_fc = WVar23;
    if ((int)WVar25 < (int)WVar23) {
      local_fc = WVar25;
    }
    if ((int)WVar25 < -1) {
      local_fc = ~CLAMP_TO_EDGE;
    }
    local_160 = WVar23;
    if ((int)WVar3 < (int)WVar23) {
      local_160 = WVar3;
    }
    if ((int)WVar3 < -1) {
      local_160 = ~CLAMP_TO_EDGE;
    }
    break;
  default:
    local_fc = ((int)WVar25 % (int)WVar23 >> 0x1f & WVar23) + (int)WVar25 % (int)WVar23;
    local_160 = ((int)WVar3 % (int)WVar23 >> 0x1f & WVar23) + (int)WVar3 % (int)WVar23;
    break;
  case 4:
    WVar26 = WVar25;
    goto LAB_001e66d9;
  case 5:
    WVar26 = WVar23 - CLAMP_TO_BORDER;
    if ((int)WVar25 < (int)(WVar23 - CLAMP_TO_BORDER)) {
      WVar26 = WVar25;
    }
    local_fc = CLAMP_TO_EDGE;
    if (-1 < (int)WVar25) {
      local_fc = WVar26;
    }
    goto LAB_001e6724;
  case 6:
    WVar26 = WVar23;
    if ((int)WVar25 < (int)WVar23) {
      WVar26 = WVar25;
    }
    if (SBORROW4(WVar25,-WVar23) != (int)(WVar25 + WVar23) < 0) {
      WVar26 = -WVar23;
    }
LAB_001e66d9:
    iVar17 = (int)WVar26 % (int)(WVar23 * 2);
    uVar14 = (iVar17 - WVar23) + (iVar17 >> 0x1f & WVar23 * 2);
    local_fc = ~((int)uVar14 >> 0x1f ^ uVar14) + WVar23;
LAB_001e66fb:
    WVar25 = WVar3;
    if (uVar39 != 4) {
      if (uVar39 != 6) {
        if (uVar39 == 5) {
LAB_001e6724:
          WVar25 = WVar23 - CLAMP_TO_BORDER;
          if ((int)WVar3 < (int)(WVar23 - CLAMP_TO_BORDER)) {
            WVar25 = WVar3;
          }
          local_160 = CLAMP_TO_EDGE;
          if (-1 < (int)WVar3) {
            local_160 = WVar25;
          }
        }
        break;
      }
      WVar25 = WVar23;
      if ((int)WVar3 < (int)WVar23) {
        WVar25 = WVar3;
      }
      if (SBORROW4(WVar3,-WVar23) != (int)(WVar3 + WVar23) < 0) {
        WVar25 = -WVar23;
      }
    }
    iVar17 = (int)WVar25 % (int)(WVar23 * 2);
    uVar14 = (iVar17 - WVar23) + (iVar17 >> 0x1f & WVar23 * 2);
    local_160 = ~((int)uVar14 >> 0x1f ^ uVar14) + WVar23;
  }
  FVar21 = iVar2 + iVar27 + LINEAR;
  uVar14 = puVar19[1];
  local_15c = NEAREST;
  local_100 = NEAREST;
  if (uVar14 < 7) {
    FVar24 = iVar2 + iVar27;
    FVar22 = FVar24;
    switch(uVar14) {
    case 0:
      local_15c = FVar1 - LINEAR;
      local_100 = local_15c;
      if ((int)FVar24 < (int)local_15c) {
        local_100 = FVar24;
      }
      if ((int)FVar24 < 0) {
        local_100 = NEAREST;
      }
      if ((int)FVar21 < (int)local_15c) {
        local_15c = FVar21;
      }
      if ((int)FVar21 < 0) {
        local_15c = NEAREST;
      }
      break;
    case 1:
      local_100 = FVar1;
      if ((int)FVar24 < (int)FVar1) {
        local_100 = FVar24;
      }
      if ((int)FVar24 < -1) {
        local_100 = ~NEAREST;
      }
      local_15c = FVar1;
      if ((int)FVar21 < (int)FVar1) {
        local_15c = FVar21;
      }
      if ((int)FVar21 < -1) {
        local_15c = ~NEAREST;
      }
      break;
    default:
      local_100 = ((int)FVar24 % (int)FVar1 >> 0x1f & FVar1) + (int)FVar24 % (int)FVar1;
      local_15c = ((int)FVar21 % (int)FVar1 >> 0x1f & FVar1) + (int)FVar21 % (int)FVar1;
      break;
    case 5:
      FVar22 = FVar1 - LINEAR;
      if ((int)FVar24 < (int)(FVar1 - LINEAR)) {
        FVar22 = FVar24;
      }
      local_100 = NEAREST;
      if (-1 < (int)FVar24) {
        local_100 = FVar22;
      }
LAB_001e6953:
      FVar22 = FVar1 - LINEAR;
      if ((int)FVar21 < (int)(FVar1 - LINEAR)) {
        FVar22 = FVar21;
      }
      local_15c = NEAREST;
      if (-1 < (int)FVar21) {
        local_15c = FVar22;
      }
      break;
    case 6:
      FVar22 = FVar1;
      if ((int)FVar24 < (int)FVar1) {
        FVar22 = FVar24;
      }
      if (SBORROW4(FVar24,-FVar1) != (int)(FVar24 + FVar1) < 0) {
        FVar22 = -FVar1;
      }
    case 4:
      iVar17 = (int)FVar22 % (int)(FVar1 * 2);
      uVar15 = (iVar17 - FVar1) + (iVar17 >> 0x1f & FVar1 * 2);
      local_100 = ~((int)uVar15 >> 0x1f ^ uVar15) + FVar1;
      goto LAB_001e6938;
    }
  }
  else {
LAB_001e6938:
    FVar22 = FVar21;
    if (uVar14 != 4) {
      if (uVar14 != 6) {
        if (uVar14 == 5) goto LAB_001e6953;
        goto LAB_001e69ac;
      }
      FVar22 = FVar1;
      if ((int)FVar21 < (int)FVar1) {
        FVar22 = FVar21;
      }
      if (SBORROW4(FVar21,-FVar1) != (int)(FVar21 + FVar1) < 0) {
        FVar22 = -FVar1;
      }
    }
    iVar17 = (int)FVar22 % (int)(FVar1 * 2);
    uVar15 = (iVar17 - FVar1) + (iVar17 >> 0x1f & FVar1 * 2);
    local_15c = ~((int)uVar15 >> 0x1f ^ uVar15) + FVar1;
  }
LAB_001e69ac:
  FVar22 = in_R8[2] + (int)local_c4 + LINEAR;
  uVar15 = puVar19[2];
  FVar21 = NEAREST;
  if (uVar15 < 7) {
    FVar24 = in_R8[2] + (int)local_c4;
    FVar21 = FVar24;
    switch(uVar15) {
    case 0:
      FVar16 = FVar20 - LINEAR;
      FVar21 = FVar16;
      if ((int)FVar24 < (int)FVar16) {
        FVar21 = FVar24;
      }
      if ((int)FVar24 < 0) {
        FVar21 = NEAREST;
      }
      if ((int)FVar22 < (int)FVar16) {
        FVar16 = FVar22;
      }
      if ((int)FVar22 < 0) {
        FVar16 = NEAREST;
      }
      break;
    case 1:
      FVar21 = FVar20;
      if ((int)FVar24 < (int)FVar20) {
        FVar21 = FVar24;
      }
      if ((int)FVar24 < -1) {
        FVar21 = ~NEAREST;
      }
      FVar16 = FVar20;
      if ((int)FVar22 < (int)FVar20) {
        FVar16 = FVar22;
      }
      if ((int)FVar22 < -1) {
        FVar16 = ~NEAREST;
      }
      break;
    default:
      FVar21 = ((int)FVar24 % (int)FVar20 >> 0x1f & FVar20) + (int)FVar24 % (int)FVar20;
      FVar16 = ((int)FVar22 % (int)FVar20 >> 0x1f & FVar20) + (int)FVar22 % (int)FVar20;
      break;
    case 5:
      FVar16 = FVar20 - LINEAR;
      if ((int)FVar24 < (int)(FVar20 - LINEAR)) {
        FVar16 = FVar24;
      }
      FVar21 = NEAREST;
      if (-1 < (int)FVar24) {
        FVar21 = FVar16;
      }
LAB_001e6aaf:
      FVar24 = FVar20 - LINEAR;
      if ((int)FVar22 < (int)(FVar20 - LINEAR)) {
        FVar24 = FVar22;
      }
      FVar16 = NEAREST;
      if (-1 < (int)FVar22) {
        FVar16 = FVar24;
      }
      break;
    case 6:
      FVar21 = FVar20;
      if ((int)FVar24 < (int)FVar20) {
        FVar21 = FVar24;
      }
      if (SBORROW4(FVar24,-FVar20) != (int)(FVar24 + FVar20) < 0) {
        FVar21 = -FVar20;
      }
    case 4:
      iVar17 = (int)FVar21 % (int)(FVar20 * 2);
      uVar18 = (iVar17 - FVar20) + (iVar17 >> 0x1f & FVar20 * 2);
      FVar21 = ~((int)uVar18 >> 0x1f ^ uVar18) + FVar20;
      goto LAB_001e6a99;
    }
  }
  else {
LAB_001e6a99:
    FVar24 = FVar22;
    if (uVar15 != 4) {
      if (uVar15 != 6) {
        FVar16 = NEAREST;
        if (uVar15 == 5) goto LAB_001e6aaf;
        goto LAB_001e6afb;
      }
      FVar24 = FVar20;
      if ((int)FVar22 < (int)FVar20) {
        FVar24 = FVar22;
      }
      if (SBORROW4(FVar22,-FVar20) != (int)(FVar22 + FVar20) < 0) {
        FVar24 = -FVar20;
      }
    }
    iVar17 = (int)FVar24 % (int)(FVar20 * 2);
    uVar18 = (iVar17 - FVar20) + (iVar17 >> 0x1f & FVar20 * 2);
    FVar16 = ~((int)uVar18 >> 0x1f ^ uVar18) + FVar20;
  }
LAB_001e6afb:
  bVar30 = uVar39 != 1;
  bVar11 = !bVar30;
  bVar33 = (int)local_fc < 0;
  bVar4 = (int)WVar23 <= (int)local_fc;
  bVar34 = -1 < (int)local_160;
  bVar5 = (int)local_160 < (int)WVar23;
  bVar31 = uVar14 != 1;
  bVar36 = -1 < (int)local_15c;
  bVar7 = (int)local_15c < (int)FVar1;
  bVar12 = !bVar31;
  bVar35 = (int)local_100 < 0;
  bVar6 = (int)FVar1 <= (int)local_100;
  bVar32 = uVar15 != 1;
  bVar38 = -1 < (int)FVar16;
  bVar9 = (int)FVar16 < (int)FVar20;
  bVar10 = !bVar32;
  bVar37 = (int)FVar21 < 0;
  bVar8 = (int)FVar20 <= (int)FVar21;
  if ((bVar11 && (bVar4 || bVar33) || bVar12 && (bVar6 || bVar35)) || (bVar10 && (bVar8 || bVar37)))
  {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)(local_58 + 0x10),sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_58._16_4_ = (undefined4)(int)local_128.order;
      fStack_44 = (float)(int)local_128.type;
      fStack_40 = (float)(int)uStack_120;
      fStack_3c = (float)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_58._16_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      fStack_44 = ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(local_128.type & 0xffff | 0x4b000000);
      fStack_40 = ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(uStack_120 & 0xffff | 0x4b000000);
      fStack_3c = ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_58._16_4_ = -1.0;
      fStack_44 = -1.0;
      fStack_40 = -1.0;
      fStack_3c = -1.0;
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)(local_58 + 0x10),i,local_fc,local_100);
  }
  if (((!bVar12 || !bVar6 && !bVar35) && (bVar30 || bVar5 && bVar34)) &&
      (!bVar10 || !bVar8 && !bVar37)) {
    lookup((ConstPixelBufferAccess *)local_58,i,local_160,local_100);
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_58,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_58._0_4_ = (undefined4)(int)local_128.order;
      local_58._4_4_ = (undefined4)(int)local_128.type;
      local_58._8_4_ = (undefined4)(int)uStack_120;
      local_58._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_58._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_58._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_58._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_58._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_58._0_4_ = -1.0;
      local_58._4_4_ = -1.0;
      local_58._8_4_ = -1.0;
      local_58._12_4_ = -1.0;
    }
  }
  if (((!bVar11 || !bVar4 && !bVar33) && (bVar31 || bVar7 && bVar36)) &&
      (!bVar10 || !bVar8 && !bVar37)) {
    lookup((ConstPixelBufferAccess *)local_68,i,local_fc,local_15c);
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_68,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_68._0_4_ = (undefined4)(int)local_128.order;
      local_68._4_4_ = (undefined4)(int)local_128.type;
      local_68._8_4_ = (undefined4)(int)uStack_120;
      local_68._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_68._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_68._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_68._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_68._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_68._0_4_ = -1.0;
      local_68._4_4_ = -1.0;
      local_68._8_4_ = -1.0;
      local_68._12_4_ = -1.0;
    }
  }
  if ((!bVar10 || !bVar8 && !bVar37) && ((bVar30 || bVar5 && bVar34) && (bVar31 || bVar7 && bVar36))
     ) {
    lookup((ConstPixelBufferAccess *)local_78,i,local_160,local_15c);
    goto LAB_001e6f3c;
  }
  TVar13 = getTextureChannelClass(sampler->wrapT);
  switch(TVar13) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((TextureFormat *)local_78,sampler);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>(&local_128,sampler);
    local_78._0_4_ = (undefined4)(int)local_128.order;
    local_78._4_4_ = (undefined4)(int)local_128.type;
    local_78._8_4_ = (undefined4)(int)uStack_120;
    local_78._12_4_ = (undefined4)(int)uStack_11c;
    goto LAB_001e6f34;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>(&local_128,sampler);
    local_78._0_4_ =
         ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_128.order & 0xffff | 0x4b000000);
    local_78._4_4_ =
         ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_128.type & 0xffff | 0x4b000000);
    local_78._8_4_ =
         ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_120 & 0xffff | 0x4b000000);
    local_78._12_4_ =
         ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_11c & 0xffff | 0x4b000000);
LAB_001e6f34:
    break;
  default:
    local_78._0_4_ = 0xbf800000;
    local_78._4_4_ = 0xbf800000;
    local_78._8_4_ = -0x40800000;
    local_78._12_4_ = -0x40800000;
  }
LAB_001e6f3c:
  if (((!bVar11 || !bVar4 && !bVar33) && (!bVar12 || !bVar6 && !bVar35)) &&
      (bVar32 || bVar9 && bVar38)) {
    lookup((ConstPixelBufferAccess *)local_88,i,local_fc,local_100);
    pCVar28 = local_e0;
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    pCVar28 = local_e0;
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_88,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_88._0_4_ = (undefined4)(int)local_128.order;
      local_88._4_4_ = (undefined4)(int)local_128.type;
      local_88._8_4_ = (undefined4)(int)uStack_120;
      local_88._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_88._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_88._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_88._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_88._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_88._0_4_ = -1.0;
      local_88._4_4_ = -1.0;
      local_88._8_4_ = -1.0;
      local_88._12_4_ = -1.0;
    }
  }
  if (((!bVar12 || !bVar6 && !bVar35) && (bVar30 || bVar5 && bVar34)) && (bVar32 || bVar9 && bVar38)
     ) {
    lookup((ConstPixelBufferAccess *)local_98,i,local_160,local_100);
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_98,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_98._0_4_ = (undefined4)(int)local_128.order;
      local_98._4_4_ = (undefined4)(int)local_128.type;
      local_98._8_4_ = (undefined4)(int)uStack_120;
      local_98._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_98._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_98._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_98._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_98._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_98._0_4_ = -1.0;
      local_98._4_4_ = -1.0;
      local_98._8_4_ = -1.0;
      local_98._12_4_ = -1.0;
    }
  }
  if (((!bVar11 || !bVar4 && !bVar33) && (bVar31 || bVar7 && bVar36)) && (bVar32 || bVar9 && bVar38)
     ) {
    lookup((ConstPixelBufferAccess *)local_a8,i,local_fc,local_15c);
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_a8,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_a8._0_4_ = (undefined4)(int)local_128.order;
      local_a8._4_4_ = (undefined4)(int)local_128.type;
      local_a8._8_4_ = (undefined4)(int)uStack_120;
      local_a8._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_a8._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_a8._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_a8._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_a8._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_a8._0_4_ = -1.0;
      local_a8._4_4_ = -1.0;
      local_a8._8_4_ = -1.0;
      local_a8._12_4_ = -1.0;
    }
  }
  local_d8 = local_d8 - local_bc;
  local_f8._0_4_ = (float)local_f8._0_4_ - local_c0;
  local_118 = local_118 - local_c4;
  if (((bVar30 || bVar5 && bVar34) && (bVar31 || bVar7 && bVar36)) && (bVar32 || bVar9 && bVar38)) {
    lookup((ConstPixelBufferAccess *)local_b8,i,local_160,local_15c);
  }
  else {
    TVar13 = getTextureChannelClass(sampler->wrapT);
    switch(TVar13) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_b8,sampler);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_128,sampler);
      local_b8._0_4_ = (undefined4)(int)local_128.order;
      local_b8._4_4_ = (undefined4)(int)local_128.type;
      local_b8._8_4_ = (undefined4)(int)uStack_120;
      local_b8._12_4_ = (undefined4)(int)uStack_11c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_128,sampler);
      local_b8._0_4_ =
           ((float)(local_128.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.order & 0xffff | 0x4b000000);
      local_b8._4_4_ =
           ((float)(local_128.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_128.type & 0xffff | 0x4b000000);
      local_b8._8_4_ =
           ((float)(uStack_120 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_120 & 0xffff | 0x4b000000);
      local_b8._12_4_ =
           ((float)(uStack_11c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_11c & 0xffff | 0x4b000000);
      break;
    default:
      local_b8._0_4_ = -1.0;
      local_b8._4_4_ = -1.0;
      local_b8._8_4_ = -1.0;
      local_b8._12_4_ = -1.0;
    }
  }
  fVar40 = 1.0 - local_d8;
  auVar42._0_4_ = 1.0 - (float)local_f8._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  fVar45 = 1.0 - local_118;
  auVar41._0_4_ =
       fVar40 * (float)local_a8._0_4_ * (float)local_f8._0_4_ * local_118 +
       (float)local_98._0_4_ * local_d8 * auVar42._0_4_ * local_118 +
       (float)local_88._0_4_ * fVar40 * auVar42._0_4_ * local_118 +
       (float)local_78._0_4_ * local_d8 * (float)local_f8._0_4_ * fVar45 +
       (float)local_68._0_4_ * fVar40 * (float)local_f8._0_4_ * fVar45 +
       (float)local_58._0_4_ * local_d8 * auVar42._0_4_ * fVar45 +
       (float)local_58._16_4_ * fVar40 * auVar42._0_4_ * fVar45;
  auVar41._4_4_ =
       fVar40 * (float)local_a8._4_4_ * (float)local_f8._0_4_ * local_118 +
       (float)local_98._4_4_ * local_d8 * auVar42._0_4_ * local_118 +
       (float)local_88._4_4_ * fVar40 * auVar42._0_4_ * local_118 +
       (float)local_78._4_4_ * local_d8 * (float)local_f8._0_4_ * fVar45 +
       (float)local_68._4_4_ * fVar40 * (float)local_f8._0_4_ * fVar45 +
       (float)local_58._4_4_ * local_d8 * auVar42._0_4_ * fVar45 +
       fStack_44 * fVar40 * auVar42._0_4_ * fVar45;
  auVar41._8_4_ =
       fVar40 * (float)local_a8._8_4_ * (float)local_f8._0_4_ * local_118 +
       (float)local_98._8_4_ * local_d8 * auVar42._0_4_ * local_118 +
       (float)local_88._8_4_ * fVar40 * auVar42._0_4_ * local_118 +
       (float)local_78._8_4_ * local_d8 * (float)local_f8._0_4_ * fVar45 +
       (float)local_68._8_4_ * fVar40 * (float)local_f8._0_4_ * fVar45 +
       (float)local_58._8_4_ * local_d8 * auVar42._0_4_ * fVar45 +
       fStack_40 * fVar40 * auVar42._0_4_ * fVar45;
  auVar41._12_4_ =
       fVar40 * (float)local_a8._12_4_ * (float)local_f8._0_4_ * local_118 +
       (float)local_98._12_4_ * local_d8 * auVar42._0_4_ * local_118 +
       (float)local_88._12_4_ * fVar40 * auVar42._0_4_ * local_118 +
       (float)local_78._12_4_ * local_d8 * (float)local_f8._0_4_ * fVar45 +
       (float)local_68._12_4_ * fVar40 * (float)local_f8._0_4_ * fVar45 +
       (float)local_58._12_4_ * local_d8 * auVar42._0_4_ * fVar45 +
       fStack_3c * fVar40 * auVar42._0_4_ * fVar45;
  (pCVar28->m_format).order =
       (ChannelOrder)
       (local_d8 * (float)local_b8._0_4_ * (float)local_f8._0_4_ * local_118 + auVar41._0_4_);
  (pCVar28->m_format).type =
       (ChannelType)
       (local_d8 * (float)local_b8._4_4_ * (float)local_f8._0_4_ * local_118 + auVar41._4_4_);
  (pCVar28->m_size).m_data[0] =
       (int)(local_d8 * (float)local_b8._8_4_ * (float)local_f8._0_4_ * local_118 + auVar41._8_4_);
  (pCVar28->m_size).m_data[1] =
       (int)(local_d8 * (float)local_b8._12_4_ * (float)local_f8._0_4_ * local_118 + auVar41._12_4_)
  ;
LAB_001e73e4:
  VVar51.m_data[0] = (float)(int)auVar41._0_8_;
  auVar53._4_4_ = (float)(int)((ulong)auVar41._0_8_ >> 0x20);
  register0x00001240 = (float)(int)auVar42._0_8_;
  register0x00001244 = (float)(int)((ulong)auVar42._0_8_ >> 0x20);
  return (Vec4)VVar51.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample3DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, float r, const IVec3& offset) const
{
	// Non-normalized coordinates.
	float u = s;
	float v = t;
	float w = r;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
		w = unnormalize(sampler.wrapR, r, m_size.z());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest3D	(*this, sampler, u, v, w, offset);
		case Sampler::LINEAR:	return sampleLinear3D	(*this, sampler, u, v, w, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}